

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

bool spdlog::details::os::mkdir_(filename_t *path)

{
  char *__path;
  int iVar1;
  
  __path = (char *)std::__cxx11::string::c_str();
  iVar1 = mkdir(__path,0x1ed);
  return iVar1 == 0;
}

Assistant:

static SPDLOG_INLINE bool mkdir_(const filename_t &path)
{
#ifdef _WIN32
#    ifdef SPDLOG_WCHAR_FILENAMES
    return ::_wmkdir(path.c_str()) == 0;
#    else
    return ::_mkdir(path.c_str()) == 0;
#    endif
#else
    return ::mkdir(path.c_str(), mode_t(0755)) == 0;
#endif
}